

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O1

amqp_connection_state_t amqp_new_connection(void)

{
  int iVar1;
  amqp_connection_state_t state;
  void *pvVar2;
  
  state = (amqp_connection_state_t)calloc(1,0x180);
  if (state != (amqp_connection_state_t)0x0) {
    iVar1 = amqp_tune_connection(state,0,0x10000,0);
    if (iVar1 == 0) {
      (state->inbound_buffer).bytes = state->header_buffer;
      (state->inbound_buffer).len = 8;
      state->state = CONNECTION_STATE_INITIAL;
      state->target_size = 8;
      (state->sock_inbound_buffer).len = 0x20000;
      pvVar2 = malloc(0x20000);
      (state->sock_inbound_buffer).bytes = pvVar2;
      if (pvVar2 != (void *)0x0) {
        init_amqp_pool(&state->properties_pool,0x200);
        return state;
      }
    }
    free((state->sock_inbound_buffer).bytes);
    free(state);
  }
  return (amqp_connection_state_t)0x0;
}

Assistant:

amqp_connection_state_t amqp_new_connection(void)
{
  int res;
  amqp_connection_state_t state =
    (amqp_connection_state_t) calloc(1, sizeof(struct amqp_connection_state_t_));

  if (state == NULL) {
    return NULL;
  }

  res = amqp_tune_connection(state, 0, AMQP_INITIAL_FRAME_POOL_PAGE_SIZE, 0);
  if (0 != res) {
    goto out_nomem;
  }

  state->inbound_buffer.bytes = state->header_buffer;
  state->inbound_buffer.len = sizeof(state->header_buffer);

  state->state = CONNECTION_STATE_INITIAL;
  /* the server protocol version response is 8 bytes, which conveniently
     is also the minimum frame size */
  state->target_size = 8;

  state->sock_inbound_buffer.len = AMQP_INITIAL_INBOUND_SOCK_BUFFER_SIZE;
  state->sock_inbound_buffer.bytes = malloc(AMQP_INITIAL_INBOUND_SOCK_BUFFER_SIZE);
  if (state->sock_inbound_buffer.bytes == NULL) {
    goto out_nomem;
  }

  init_amqp_pool(&state->properties_pool, 512);

  return state;

out_nomem:
  free(state->sock_inbound_buffer.bytes);
  free(state);
  return NULL;
}